

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

void __thiscall
gl4cts::GPUShaderFP64Test10::prepareTestData
          (GPUShaderFP64Test10 *this,functionObject *function_object)

{
  pointer puVar1;
  GLuint GVar2;
  GLuint GVar3;
  uint uVar4;
  uint uVar5;
  GLubyte *buffer;
  GLuint vertex;
  long lVar6;
  
  GVar2 = functionObject::getResultStride(function_object);
  GVar3 = functionObject::getArgumentStride(function_object);
  puVar1 = (this->m_argument_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_argument_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar1) {
    (this->m_argument_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar1;
  }
  puVar1 = (this->m_expected_results_data).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_expected_results_data).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->m_expected_results_data).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->m_argument_data,(ulong)(GVar3 << 10));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->m_expected_results_data,(ulong)(GVar2 << 10));
  uVar5 = 0;
  uVar4 = 0;
  for (lVar6 = 0; lVar6 != 0x400; lVar6 = lVar6 + 1) {
    puVar1 = (this->m_expected_results_data).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    buffer = (this->m_argument_data).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + uVar4;
    prepareArgument(this,function_object,(GLuint)lVar6,buffer);
    (*function_object->_vptr_functionObject[2])(function_object,puVar1 + uVar5,buffer);
    uVar4 = uVar4 + GVar3;
    uVar5 = uVar5 + GVar2;
  }
  return;
}

Assistant:

void GPUShaderFP64Test10::prepareTestData(const functionObject& function_object)
{
	const glw::GLuint result_stride		   = function_object.getResultStride();
	const glw::GLuint result_buffer_size   = result_stride * m_n_veritces;
	const glw::GLuint argument_stride	  = function_object.getArgumentStride();
	const glw::GLuint argument_buffer_size = m_n_veritces * argument_stride;

	m_argument_data.clear();
	m_expected_results_data.clear();

	m_argument_data.resize(argument_buffer_size);
	m_expected_results_data.resize(result_buffer_size);

	for (glw::GLuint vertex = 0; vertex < m_n_veritces; ++vertex)
	{
		const glw::GLuint result_offset   = vertex * result_stride;
		glw::GLdouble*	result_dst	  = (glw::GLdouble*)&m_expected_results_data[result_offset];
		const glw::GLuint argument_offset = vertex * argument_stride;
		glw::GLubyte*	 argument_dst	= &m_argument_data[argument_offset];

		prepareArgument(function_object, vertex, argument_dst);
		function_object.call(result_dst, argument_dst);
	}
}